

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O3

BindingMap * __thiscall r_exec::BindingMap::get_atom_variable(BindingMap *this,Atom *a)

{
  atomic_int_fast64_t *paVar1;
  long *plVar2;
  char cVar3;
  long lVar4;
  AtomValue *this_00;
  undefined4 *in_RDX;
  ulong uVar5;
  undefined4 local_40;
  undefined4 local_3c;
  P<r_exec::Value> local_38;
  
  lVar4 = *(long *)(a + 0x10);
  if (*(long *)(a + 0x18) == lVar4) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      plVar2 = *(long **)(lVar4 + uVar5 * 8);
      local_3c = *in_RDX;
      cVar3 = (**(code **)(*plVar2 + 0x60))(plVar2,(Atom *)&local_3c);
      r_code::Atom::~Atom((Atom *)&local_3c);
      if (cVar3 != '\0') goto LAB_00158e23;
      uVar5 = uVar5 + 1;
      lVar4 = *(long *)(a + 0x10);
    } while (uVar5 < (ulong)(*(long *)(a + 0x18) - lVar4 >> 3));
    uVar5 = (ulong)(*(long *)(a + 0x18) - lVar4) >> 3 & 0x1fffffff;
  }
  this_00 = (AtomValue *)operator_new(0x20);
  local_40 = *in_RDX;
  AtomValue::AtomValue(this_00,(BindingMap *)a,(Atom *)&local_40);
  LOCK();
  paVar1 = &(this_00->super_BoundValue).super_Value.super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_38.object = (_Object *)this_00;
  std::vector<core::P<r_exec::Value>,std::allocator<core::P<r_exec::Value>>>::
  emplace_back<core::P<r_exec::Value>>
            ((vector<core::P<r_exec::Value>,std::allocator<core::P<r_exec::Value>>> *)(a + 0x10),
             &local_38);
  if ((AtomValue *)local_38.object != (AtomValue *)0x0) {
    LOCK();
    ((local_38.object)->refCount).super___atomic_base<long>._M_i =
         ((local_38.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_38.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*(((BoundValue *)&(local_38.object)->_vptr__Object)->super_Value).super__Object._vptr__Object
        [1])();
    }
  }
  r_code::Atom::~Atom((Atom *)&local_40);
LAB_00158e23:
  r_code::Atom::VLPointer((ushort)this,(ushort)uVar5);
  return this;
}

Assistant:

Atom BindingMap::get_atom_variable(Atom a)
{
    for (uint64_t i = 0; i < map.size(); ++i) {
        if (map[i]->contains(a)) {
            return Atom::VLPointer(i);
        }
    }

    uint64_t size = map.size();
    map.push_back(new AtomValue(this, a));
    return Atom::VLPointer(size);
}